

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.cpp
# Opt level: O3

double * numerary::Numerary::linear_regression(double *X,double *Y,int *n)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pdVar2 = (double *)operator_new__(0x10);
  iVar1 = *n;
  dVar5 = 0.0;
  dVar6 = 0.0;
  if ((long)iVar1 < 1) {
    dVar7 = 0.0;
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    lVar3 = 0;
    dVar7 = 0.0;
    do {
      dVar8 = X[lVar3];
      dVar7 = dVar7 + dVar8;
      dVar4 = dVar4 + Y[lVar3];
      dVar5 = dVar5 + dVar8 * Y[lVar3];
      dVar6 = dVar6 + dVar8 * dVar8;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  dVar8 = (double)iVar1;
  dVar5 = (dVar8 * dVar5 - dVar4 * dVar7) / (dVar6 * dVar8 - dVar7 * dVar7);
  *pdVar2 = dVar5;
  pdVar2[1] = (dVar4 - dVar5 * dVar7) / dVar8;
  return pdVar2;
}

Assistant:

double* Numerary::linear_regression(double *X, double *Y, const int& n) {
        int i;
        double E_X = 0, E_Y = 0, E_XY = 0, E_X2 = 0, *ab = new double[2];

        for (i = 0; i < n; i++) {
            E_X     += X[i]; // Mathematical Expectation of X
            E_X2    += (X[i]*X[i]); // Mathematical Expectation of X^2
            E_Y     += Y[i]; // Mathematical Expectation of Y
            E_XY    += (X[i]*Y[i]); // Mathematical Expectation of X*Y
        }

        // Calculating coefficients of line (y = a*x + b)
        ab[0] = (n*E_XY - E_X*E_Y) / (n*E_X2 - E_X*E_X); // a
        ab[1] = (E_Y - ab[0]*E_X) / ((double) n); // b
        
        return ab;
    }